

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O0

bool tinyusdz::tydra::detail::FlattenSkelNode
               (SkelNode *node,vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints,
               vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *jointNames,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *bindTransforms,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *restTransforms,string *err)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *pvVar5;
  reference pvVar6;
  pointer *this;
  reference node_00;
  SkelNode *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_> *__range2;
  Token local_68;
  ulong local_48;
  size_t idx;
  string *err_local;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
  *restTransforms_local;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
  *bindTransforms_local;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *jointNames_local;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints_local;
  SkelNode *node_local;
  
  iVar1 = node->joint_id;
  local_48 = (long)iVar1;
  idx = (size_t)err;
  err_local = (string *)restTransforms;
  restTransforms_local = bindTransforms;
  bindTransforms_local =
       (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)jointNames;
  jointNames_local = joints;
  joints_local = (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)node;
  sVar3 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size(joints);
  if ((ulong)(long)iVar1 < sVar3) {
    Token::Token(&local_68,(string *)joints_local);
    pvVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                       ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                        jointNames_local,local_48);
    Token::operator=(pvVar4,&local_68);
    Token::~Token(&local_68);
    Token::Token((Token *)&__range2,
                 (string *)
                 &joints_local[1].
                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    pvVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                       ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                        bindTransforms_local,local_48);
    Token::operator=(pvVar4,(Token *)&__range2);
    Token::~Token((Token *)&__range2);
    pvVar5 = joints_local + 3;
    pvVar6 = ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
             operator[](restTransforms_local,local_48);
    memcpy(pvVar6,pvVar5,0x80);
    pvVar5 = joints_local + 8;
    pvVar6 = ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
             operator[]((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                         *)err_local,local_48);
    memcpy(pvVar6,&(pvVar5->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                   _M_impl.super__Vector_impl_data._M_finish,0x80);
    this = &joints_local[0xd].super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2 = ::std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>::
             begin((vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_> *)
                   this);
    child = (SkelNode *)
            ::std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>::
            end((vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_> *)
                this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_tinyusdz::tydra::SkelNode_*,_std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>_>
                                       *)&child), bVar2) {
      node_00 = __gnu_cxx::
                __normal_iterator<const_tinyusdz::tydra::SkelNode_*,_std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>_>
                ::operator*(&__end2);
      bVar2 = FlattenSkelNode(node_00,jointNames_local,
                              (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                              bindTransforms_local,restTransforms_local,
                              (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                               *)err_local,(string *)idx);
      if (!bVar2) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::tydra::SkelNode_*,_std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>_>
      ::operator++(&__end2);
    }
    node_local._7_1_ = true;
  }
  else {
    if (idx != 0) {
      ::std::__cxx11::string::operator+=((string *)idx,"joint_id out-of-bounds.");
    }
    node_local._7_1_ = false;
  }
  return node_local._7_1_;
}

Assistant:

static bool FlattenSkelNode(const SkelNode &node,
  std::vector<value::token> &joints,
  std::vector<value::token> &jointNames,
  std::vector<value::matrix4d> &bindTransforms,
  std::vector<value::matrix4d> &restTransforms, std::string *err) {

  size_t idx = size_t(node.joint_id);
  if (idx >= joints.size()) {
    if (err) {
      (*err) += "joint_id out-of-bounds.";
    }
    return false;
  }

  joints[idx] = value::token(node.joint_path);
  jointNames[idx] = value::token(node.joint_name);
  bindTransforms[idx] = node.bind_transform;
  restTransforms[idx] = node.rest_transform;

  for (const auto &child : node.children) {
    if (!FlattenSkelNode(child, joints, jointNames, bindTransforms, restTransforms, err)) {
      return false;
    }
  }

  return true;
}